

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GGMTree.cpp
# Opt level: O3

vector<GGMNode,_std::allocator<GGMNode>_> * __thiscall
GGMTree::min_coverage
          (vector<GGMNode,_std::allocator<GGMNode>_> *__return_storage_ptr__,GGMTree *this,
          vector<GGMNode,_std::allocator<GGMNode>_> *node_list)

{
  pointer pGVar1;
  long lVar2;
  undefined8 uVar3;
  uint8_t uVar4;
  uint8_t uVar5;
  uint8_t uVar6;
  uint8_t uVar7;
  pointer pGVar8;
  pointer pGVar9;
  ulong uVar10;
  int iVar11;
  int iVar12;
  ulong uVar13;
  vector<GGMNode,_std::allocator<GGMNode>_> next_level_node;
  value_type node1;
  vector<GGMNode,_std::allocator<GGMNode>_> local_b8;
  GGMTree *local_a0;
  vector<GGMNode,_std::allocator<GGMNode>_> *local_98;
  vector<GGMNode,_std::allocator<GGMNode>_> local_90;
  GGMNode local_78;
  GGMNode local_58;
  
  local_b8.super__Vector_base<GGMNode,_std::allocator<GGMNode>_>._M_impl.super__Vector_impl_data.
  _M_start = (GGMNode *)0x0;
  local_b8.super__Vector_base<GGMNode,_std::allocator<GGMNode>_>._M_impl.super__Vector_impl_data.
  _M_finish = (GGMNode *)0x0;
  local_b8.super__Vector_base<GGMNode,_std::allocator<GGMNode>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (GGMNode *)0x0;
  pGVar8 = (node_list->super__Vector_base<GGMNode,_std::allocator<GGMNode>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pGVar9 = (node_list->super__Vector_base<GGMNode,_std::allocator<GGMNode>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if ((long)pGVar9 - (long)pGVar8 != 0) {
    uVar10 = (long)pGVar9 - (long)pGVar8 >> 5;
    uVar13 = 0;
    iVar11 = 0;
    local_a0 = this;
    local_98 = __return_storage_ptr__;
    do {
      pGVar9 = pGVar8 + uVar13;
      pGVar1 = pGVar8 + uVar13;
      local_58.index = pGVar1->index;
      local_58.level = pGVar1->level;
      local_58.key[0] = pGVar1->key[0];
      local_58.key[1] = pGVar1->key[1];
      local_58.key[2] = pGVar1->key[2];
      local_58.key[3] = pGVar1->key[3];
      local_58.key._4_8_ = *(undefined8 *)(pGVar8[uVar13].key + 4);
      local_58._24_8_ = *(undefined8 *)(pGVar8[uVar13].key + 4 + 8);
      iVar12 = iVar11 + 1;
      uVar13 = (ulong)iVar12;
      if (uVar10 == uVar13) {
        if (local_b8.super__Vector_base<GGMNode,_std::allocator<GGMNode>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            local_b8.super__Vector_base<GGMNode,_std::allocator<GGMNode>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<GGMNode,std::allocator<GGMNode>>::_M_realloc_insert<GGMNode&>
                    ((vector<GGMNode,std::allocator<GGMNode>> *)&local_b8,
                     (iterator)
                     local_b8.super__Vector_base<GGMNode,_std::allocator<GGMNode>_>._M_impl.
                     super__Vector_impl_data._M_finish,&local_58);
        }
        else {
LAB_00103667:
          lVar2 = pGVar9->index;
          iVar11 = pGVar9->level;
          uVar4 = pGVar9->key[0];
          uVar5 = pGVar9->key[1];
          uVar6 = pGVar9->key[2];
          uVar7 = pGVar9->key[3];
          uVar3 = *(undefined8 *)(pGVar9->key + 0xc);
          *(undefined8 *)
           ((local_b8.super__Vector_base<GGMNode,_std::allocator<GGMNode>_>._M_impl.
             super__Vector_impl_data._M_finish)->key + 4) = *(undefined8 *)(pGVar9->key + 4);
          *(undefined8 *)
           ((local_b8.super__Vector_base<GGMNode,_std::allocator<GGMNode>_>._M_impl.
             super__Vector_impl_data._M_finish)->key + 0xc) = uVar3;
          (local_b8.super__Vector_base<GGMNode,_std::allocator<GGMNode>_>._M_impl.
           super__Vector_impl_data._M_finish)->index = lVar2;
          (local_b8.super__Vector_base<GGMNode,_std::allocator<GGMNode>_>._M_impl.
           super__Vector_impl_data._M_finish)->level = iVar11;
          (local_b8.super__Vector_base<GGMNode,_std::allocator<GGMNode>_>._M_impl.
           super__Vector_impl_data._M_finish)->key[0] = uVar4;
          (local_b8.super__Vector_base<GGMNode,_std::allocator<GGMNode>_>._M_impl.
           super__Vector_impl_data._M_finish)->key[1] = uVar5;
          (local_b8.super__Vector_base<GGMNode,_std::allocator<GGMNode>_>._M_impl.
           super__Vector_impl_data._M_finish)->key[2] = uVar6;
          (local_b8.super__Vector_base<GGMNode,_std::allocator<GGMNode>_>._M_impl.
           super__Vector_impl_data._M_finish)->key[3] = uVar7;
          local_b8.super__Vector_base<GGMNode,_std::allocator<GGMNode>_>._M_impl.
          super__Vector_impl_data._M_finish =
               local_b8.super__Vector_base<GGMNode,_std::allocator<GGMNode>_>._M_impl.
               super__Vector_impl_data._M_finish + 1;
        }
      }
      else {
        if ((ulong)(pGVar8[uVar13].index ^ local_58.index) < 2) {
          if (local_58.level == pGVar8[uVar13].level) {
            local_78.index = local_58.index >> 1;
            local_78.level = pGVar8[uVar13].level - 1;
            local_78.key[0] = '\0';
            local_78.key[1] = '\0';
            local_78.key[2] = '\0';
            local_78.key[3] = '\0';
            local_78.key[4] = '\0';
            local_78.key[5] = '\0';
            local_78.key[6] = '\0';
            local_78.key[7] = '\0';
            local_78.key[8] = '\0';
            local_78.key[9] = '\0';
            local_78.key[10] = '\0';
            local_78.key[0xb] = '\0';
            local_78.key[0xc] = '\0';
            local_78.key[0xd] = '\0';
            local_78.key[0xe] = '\0';
            local_78.key[0xf] = '\0';
            if (local_b8.super__Vector_base<GGMNode,_std::allocator<GGMNode>_>._M_impl.
                super__Vector_impl_data._M_finish ==
                local_b8.super__Vector_base<GGMNode,_std::allocator<GGMNode>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<GGMNode,_std::allocator<GGMNode>_>::_M_realloc_insert<GGMNode>
                        (&local_b8,
                         (iterator)
                         local_b8.super__Vector_base<GGMNode,_std::allocator<GGMNode>_>._M_impl.
                         super__Vector_impl_data._M_finish,&local_78);
            }
            else {
              uVar10 = (ulong)(uint)local_78.level;
              (local_b8.super__Vector_base<GGMNode,_std::allocator<GGMNode>_>._M_impl.
               super__Vector_impl_data._M_finish)->key[4] = '\0';
              (local_b8.super__Vector_base<GGMNode,_std::allocator<GGMNode>_>._M_impl.
               super__Vector_impl_data._M_finish)->key[5] = '\0';
              (local_b8.super__Vector_base<GGMNode,_std::allocator<GGMNode>_>._M_impl.
               super__Vector_impl_data._M_finish)->key[6] = '\0';
              (local_b8.super__Vector_base<GGMNode,_std::allocator<GGMNode>_>._M_impl.
               super__Vector_impl_data._M_finish)->key[7] = '\0';
              (local_b8.super__Vector_base<GGMNode,_std::allocator<GGMNode>_>._M_impl.
               super__Vector_impl_data._M_finish)->key[8] = '\0';
              (local_b8.super__Vector_base<GGMNode,_std::allocator<GGMNode>_>._M_impl.
               super__Vector_impl_data._M_finish)->key[9] = '\0';
              (local_b8.super__Vector_base<GGMNode,_std::allocator<GGMNode>_>._M_impl.
               super__Vector_impl_data._M_finish)->key[10] = '\0';
              (local_b8.super__Vector_base<GGMNode,_std::allocator<GGMNode>_>._M_impl.
               super__Vector_impl_data._M_finish)->key[0xb] = '\0';
              *(ulong *)((local_b8.super__Vector_base<GGMNode,_std::allocator<GGMNode>_>._M_impl.
                          super__Vector_impl_data._M_finish)->key + 0xc) =
                   (ulong)(uint)local_78._28_4_ << 0x20;
              (local_b8.super__Vector_base<GGMNode,_std::allocator<GGMNode>_>._M_impl.
               super__Vector_impl_data._M_finish)->index = local_78.index;
              (local_b8.super__Vector_base<GGMNode,_std::allocator<GGMNode>_>._M_impl.
               super__Vector_impl_data._M_finish)->level = (int)uVar10;
              (local_b8.super__Vector_base<GGMNode,_std::allocator<GGMNode>_>._M_impl.
               super__Vector_impl_data._M_finish)->key[0] = (char)(uVar10 >> 0x20);
              (local_b8.super__Vector_base<GGMNode,_std::allocator<GGMNode>_>._M_impl.
               super__Vector_impl_data._M_finish)->key[1] = (char)(uVar10 >> 0x28);
              (local_b8.super__Vector_base<GGMNode,_std::allocator<GGMNode>_>._M_impl.
               super__Vector_impl_data._M_finish)->key[2] = (char)(uVar10 >> 0x30);
              (local_b8.super__Vector_base<GGMNode,_std::allocator<GGMNode>_>._M_impl.
               super__Vector_impl_data._M_finish)->key[3] = (char)(uVar10 >> 0x38);
              local_b8.super__Vector_base<GGMNode,_std::allocator<GGMNode>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   local_b8.super__Vector_base<GGMNode,_std::allocator<GGMNode>_>._M_impl.
                   super__Vector_impl_data._M_finish + 1;
            }
            iVar12 = iVar11 + 2;
            uVar13 = (ulong)iVar12;
            goto LAB_001036a2;
          }
        }
        if (local_b8.super__Vector_base<GGMNode,_std::allocator<GGMNode>_>._M_impl.
            super__Vector_impl_data._M_finish !=
            local_b8.super__Vector_base<GGMNode,_std::allocator<GGMNode>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) goto LAB_00103667;
        std::vector<GGMNode,std::allocator<GGMNode>>::_M_realloc_insert<GGMNode&>
                  ((vector<GGMNode,std::allocator<GGMNode>> *)&local_b8,
                   (iterator)
                   local_b8.super__Vector_base<GGMNode,_std::allocator<GGMNode>_>._M_impl.
                   super__Vector_impl_data._M_finish,&local_58);
      }
LAB_001036a2:
      __return_storage_ptr__ = local_98;
      pGVar8 = (node_list->super__Vector_base<GGMNode,_std::allocator<GGMNode>_>)._M_impl.
               super__Vector_impl_data._M_start;
      pGVar9 = (node_list->super__Vector_base<GGMNode,_std::allocator<GGMNode>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      uVar10 = (long)pGVar9 - (long)pGVar8 >> 5;
      iVar11 = iVar12;
    } while (uVar13 < uVar10);
    if ((long)local_b8.super__Vector_base<GGMNode,_std::allocator<GGMNode>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)local_b8.super__Vector_base<GGMNode,_std::allocator<GGMNode>_>._M_impl.
              super__Vector_impl_data._M_start != (long)pGVar9 - (long)pGVar8 &&
        local_b8.super__Vector_base<GGMNode,_std::allocator<GGMNode>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        local_b8.super__Vector_base<GGMNode,_std::allocator<GGMNode>_>._M_impl.
        super__Vector_impl_data._M_start) {
      std::vector<GGMNode,_std::allocator<GGMNode>_>::vector(&local_90,&local_b8);
      min_coverage(__return_storage_ptr__,local_a0,&local_90);
      if (local_90.super__Vector_base<GGMNode,_std::allocator<GGMNode>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_90.super__Vector_base<GGMNode,_std::allocator<GGMNode>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_90.super__Vector_base<GGMNode,_std::allocator<GGMNode>_>._M_impl
                              .super__Vector_impl_data._M_end_of_storage -
                        (long)local_90.super__Vector_base<GGMNode,_std::allocator<GGMNode>_>._M_impl
                              .super__Vector_impl_data._M_start);
      }
      goto LAB_00103734;
    }
  }
  (__return_storage_ptr__->super__Vector_base<GGMNode,_std::allocator<GGMNode>_>)._M_impl.
  super__Vector_impl_data._M_start = pGVar8;
  (__return_storage_ptr__->super__Vector_base<GGMNode,_std::allocator<GGMNode>_>)._M_impl.
  super__Vector_impl_data._M_finish = pGVar9;
  (__return_storage_ptr__->super__Vector_base<GGMNode,_std::allocator<GGMNode>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (node_list->super__Vector_base<GGMNode,_std::allocator<GGMNode>_>)._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  (node_list->super__Vector_base<GGMNode,_std::allocator<GGMNode>_>)._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x0;
  (node_list->super__Vector_base<GGMNode,_std::allocator<GGMNode>_>)._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x0;
  (node_list->super__Vector_base<GGMNode,_std::allocator<GGMNode>_>)._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)0x0;
LAB_00103734:
  if (local_b8.super__Vector_base<GGMNode,_std::allocator<GGMNode>_>._M_impl.super__Vector_impl_data
      ._M_start != (GGMNode *)0x0) {
    operator_delete(local_b8.super__Vector_base<GGMNode,_std::allocator<GGMNode>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_b8.super__Vector_base<GGMNode,_std::allocator<GGMNode>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_b8.super__Vector_base<GGMNode,_std::allocator<GGMNode>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

vector<GGMNode> GGMTree::min_coverage(vector<GGMNode> node_list) {
    vector<GGMNode> next_level_node;

    for (int i = 0; i < node_list.size(); ++i) {
        auto node1 = node_list[i];

        if(i + 1 == node_list.size()) {
            next_level_node.emplace_back(node1);
        } else {
            auto node2 = node_list[i + 1];
            // same parent in the binary path
            if(((node1.index >> 1) == (node2.index >> 1)) && (node1.level == node2.level)) {
                next_level_node.emplace_back(GGMNode(node1.index >> 1, node1.level - 1));
                i++;
            } else {
                next_level_node.emplace_back(node1);
            }
        }
    }

    // no merge return
    if (next_level_node.size() == node_list.size() || next_level_node.empty()) {
        return node_list;
    }

    return min_coverage(next_level_node);
}